

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_template(JSParseState *s,int call,int *argc)

{
  JSToken *token;
  anon_union_32_4_06729a41_for_u *paVar1;
  int iVar2;
  JSContext *ctx;
  JSShape *pJVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSContext *pJVar6;
  JSValue JVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  JSValueUnion JVar13;
  JSRefCountHeader *p_3;
  uint8_t *p_00;
  int64_t iVar14;
  JSRefCountHeader *p;
  JSValueUnion JVar15;
  JSValue v;
  JSValue val;
  JSValue v_00;
  JSValue obj;
  JSValue JVar16;
  JSValue JVar17;
  JSValue prop;
  JSValue prop_00;
  JSValueUnion local_a8;
  JSValueUnion local_98;
  int64_t iStack_90;
  int *local_88;
  int local_7c;
  JSValueUnion local_78;
  int64_t local_70;
  JSToken local_68;
  uint8_t *local_38;
  
  ctx = s->ctx;
  local_88 = argc;
  if (call == 0) {
    JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    local_78.float64 = 0.0;
    local_70 = 3;
  }
  else {
    pJVar3 = ctx->array_shape;
    (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
    JVar16 = JS_NewObjectFromShape(ctx,pJVar3,2);
    if ((uint)JVar16.tag == 6) {
      return -1;
    }
    iVar10 = emit_push_const(s,JVar16,0);
    if ((0xfffffff4 < (uint)JVar16.tag) &&
       (iVar11 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar11 + -1, iVar11 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar16);
    }
    if (iVar10 != 0) {
      return -1;
    }
    pJVar3 = ctx->array_shape;
    (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
    JVar17 = JS_NewObjectFromShape(ctx,pJVar3,2);
    local_70 = JVar17.tag;
    local_78 = JVar17.u;
    if ((int)JVar17.tag == 6) {
      return -1;
    }
    iVar10 = JS_DefinePropertyValue(ctx,JVar16,0x70,JVar17,0x4000);
    if (iVar10 < 0) {
      return -1;
    }
  }
  local_a8 = JVar16.u;
  if ((s->token).val == -0x7e) {
    token = &s->token;
    JVar15.float64 = 0.0;
    local_7c = call;
    do {
      p_00 = (s->token).ptr + 1;
      local_68.val = token->val;
      local_68.line_num = token->line_num;
      local_68.ptr = (s->token).ptr;
      local_68.u.str.str.u = (JSValueUnion)*(undefined8 *)&(s->token).u;
      local_68.u.str.str.tag = *(int64_t *)((long)&(s->token).u + 8);
      local_68.u.regexp.flags.u = (s->token).u.regexp.flags.u;
      local_68.u.regexp.flags.tag = (s->token).u.regexp.flags.tag;
      paVar1 = &(s->token).u;
      JVar4 = (JSValueUnion)*(JSValueUnion *)paVar1;
      iVar5 = (s->token).u.str.str.tag;
      JVar7 = (paVar1->str).str;
      JVar17 = (paVar1->str).str;
      uVar12 = (uint)iVar5;
      iVar10 = JVar15.int32;
      if (local_7c == 0) {
        if ((0xfffffff4 < uVar12) &&
           (iVar11 = *JVar4.ptr, *(int *)JVar4.ptr = iVar11 + -1, iVar11 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar17);
        }
        (s->token).u.ident.atom = 0;
        (s->token).u.str.str.tag = 3;
        iVar11 = js_parse_string(s,0x60,1,p_00,&local_68,&local_38);
        uVar9 = local_68.u.str.str.tag;
        uVar8 = local_68.u.str.str.u;
        if (iVar11 != 0) {
          return -1;
        }
        uVar12 = (uint)local_68.u.str.str.tag;
        if (((*(uint *)((long)local_68.u.str.str.u + 4) & 0x7fffffff) == 0) && (iVar10 != 0)) {
          if (0xfffffff4 < uVar12) {
            pJVar6 = s->ctx;
            iVar11 = *(int *)local_68.u.str.str.u;
            *(int *)local_68.u.str.str.u = iVar11 + -1;
            if (iVar11 < 2) {
              v.tag = local_68.u.str.str.tag;
              v.u.ptr = (void *)local_68.u.str.str.u;
              __JS_FreeValueRT(pJVar6->rt,v);
            }
          }
        }
        else {
          val.tag = local_68.u.str.str.tag;
          val.u.ptr = (void *)local_68.u.str.str.u;
          iVar11 = emit_push_const(s,val,1);
          if (0xfffffff4 < uVar12) {
            pJVar6 = s->ctx;
            iVar2 = *(int *)uVar8;
            *(int *)uVar8 = iVar2 + -1;
            if (iVar2 < 2) {
              v_00.tag = uVar9;
              v_00.u.ptr = (void *)uVar8;
              __JS_FreeValueRT(pJVar6->rt,v_00);
            }
          }
          if (iVar11 != 0) {
            return -1;
          }
          if (iVar10 == 0) {
            if ((s->token).u.str.sep == 0x60) goto LAB_00158fc2;
            emit_op(s,'B');
            local_98.int32 = 0x5c;
            dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_98.int32,4);
          }
          iVar10 = iVar10 + 1;
        }
        if ((s->token).u.str.sep == 0x60) {
          emit_op(s,'$');
          local_98.int32._0_2_ = (short)iVar10 + -1;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_98.int32,2);
LAB_00158fc2:
          iVar10 = next_token(s);
          return iVar10;
        }
      }
      else {
        if (0xfffffff4 < uVar12) {
          *(int *)JVar4.ptr = *JVar4.ptr + 1;
        }
        JVar13.float64 = (double)JVar15.float64;
        if (-1 < iVar10) {
          JVar13 = JVar15;
        }
        iVar14 = 7;
        if (-1 < iVar10) {
          iVar14 = 0;
        }
        JVar17.tag = local_70;
        JVar17.u.ptr = local_78.ptr;
        prop.tag = iVar14;
        prop.u.float64 = JVar13.float64;
        local_98 = JVar4;
        iStack_90 = iVar5;
        iVar11 = JS_DefinePropertyValueValue(ctx,JVar17,prop,JVar7,0x4004);
        if (iVar11 < 0) {
          return -1;
        }
        iVar11 = js_parse_string(s,0x60,0,p_00,&local_68,&local_38);
        if (iVar11 != 0) {
          local_68.u.str.str.u = (JSValueUnion)((ulong)local_68.u.str.str.u & 0xffffffff00000000);
          local_68.u.str.str.tag = 3;
        }
        local_98.ptr = (void *)local_68.u.str.str.u;
        JVar7.tag = local_68.u.str.str.tag;
        JVar7.u.ptr = (void *)local_68.u.str.str.u;
        prop_00.tag = iVar14;
        prop_00.u.float64 = JVar13.float64;
        iStack_90 = local_68.u.str.str.tag;
        iVar11 = JS_DefinePropertyValueValue(ctx,JVar16,prop_00,JVar7,0x4004);
        if (iVar11 < 0) {
          return -1;
        }
        if ((s->token).u.str.sep == 0x60) {
          JVar16.tag = extraout_RDX;
          JVar16.u.ptr = local_78.ptr;
          seal_template_obj(ctx,JVar16);
          obj.tag = extraout_RDX_00;
          obj.u.float64 = local_a8.float64;
          seal_template_obj(ctx,obj);
          *local_88 = iVar10 + 1;
          goto LAB_00158fc2;
        }
      }
      iVar11 = next_token(s);
      if ((iVar11 != 0) || (iVar11 = js_parse_expr2(s,1), iVar11 != 0)) {
        return -1;
      }
      if (token->val != 0x7d) {
        js_parse_error(s,"expected \'}\' after template expression");
        return -1;
      }
      free_token(s,token);
      s->got_lf = 0;
      s->last_line_num = (s->token).line_num;
      iVar11 = js_parse_template_part(s,s->buf_ptr);
      if (iVar11 != 0) {
        return -1;
      }
      JVar15._0_4_ = iVar10 + 1;
      JVar15._4_4_ = 0;
    } while (token->val == -0x7e);
  }
  iVar10 = js_parse_expect(s,-0x7e);
  return iVar10;
}

Assistant:

static __exception int js_parse_template(JSParseState *s, int call, int *argc)
{
    JSContext *ctx = s->ctx;
    JSValue raw_array, template_object;
    JSToken cooked;
    int depth, ret;

    raw_array = JS_UNDEFINED; /* avoid warning */
    template_object = JS_UNDEFINED; /* avoid warning */
    if (call) {
        /* Create a template object: an array of cooked strings */
        /* Create an array of raw strings and store it to the raw property */
        template_object = JS_NewArray(ctx);
        if (JS_IsException(template_object))
            return -1;
        //        pool_idx = s->cur_func->cpool_count;
        ret = emit_push_const(s, template_object, 0);
        JS_FreeValue(ctx, template_object);
        if (ret)
            return -1;
        raw_array = JS_NewArray(ctx);
        if (JS_IsException(raw_array))
            return -1;
        if (JS_DefinePropertyValue(ctx, template_object, JS_ATOM_raw,
                                   raw_array, JS_PROP_THROW) < 0) {
            return -1;
        }
    }

    depth = 0;
    while (s->token.val == TOK_TEMPLATE) {
        const uint8_t *p = s->token.ptr + 1;
        cooked = s->token;
        if (call) {
            if (JS_DefinePropertyValueUint32(ctx, raw_array, depth,
                                             JS_DupValue(ctx, s->token.u.str.str),
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
            /* re-parse the string with escape sequences but do not throw a
               syntax error if it contains invalid sequences
             */
            if (js_parse_string(s, '`', FALSE, p, &cooked, &p)) {
                cooked.u.str.str = JS_UNDEFINED;
            }
            if (JS_DefinePropertyValueUint32(ctx, template_object, depth,
                                             cooked.u.str.str,
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
        } else {
            JSString *str;
            /* re-parse the string with escape sequences and throw a
               syntax error if it contains invalid sequences
             */
            JS_FreeValue(ctx, s->token.u.str.str);
            s->token.u.str.str = JS_UNDEFINED;
            if (js_parse_string(s, '`', TRUE, p, &cooked, &p))
                return -1;
            str = JS_VALUE_GET_STRING(cooked.u.str.str);
            if (str->len != 0 || depth == 0) {
                ret = emit_push_const(s, cooked.u.str.str, 1);
                JS_FreeValue(s->ctx, cooked.u.str.str);
                if (ret)
                    return -1;
                if (depth == 0) {
                    if (s->token.u.str.sep == '`')
                        goto done1;
                    emit_op(s, OP_get_field2);
                    emit_atom(s, JS_ATOM_concat);
                }
                depth++;
            } else {
                JS_FreeValue(s->ctx, cooked.u.str.str);
            }
        }
        if (s->token.u.str.sep == '`')
            goto done;
        if (next_token(s))
            return -1;
        if (js_parse_expr(s))
            return -1;
        depth++;
        if (s->token.val != '}') {
            return js_parse_error(s, "expected '}' after template expression");
        }
        /* XXX: should convert to string at this stage? */
        free_token(s, &s->token);
        /* Resume TOK_TEMPLATE parsing (s->token.line_num and
         * s->token.ptr are OK) */
        s->got_lf = FALSE;
        s->last_line_num = s->token.line_num;
        if (js_parse_template_part(s, s->buf_ptr))
            return -1;
    }
    return js_parse_expect(s, TOK_TEMPLATE);

 done:
    if (call) {
        /* Seal the objects */
        seal_template_obj(ctx, raw_array);
        seal_template_obj(ctx, template_object);
        *argc = depth + 1;
    } else {
        emit_op(s, OP_call_method);
        emit_u16(s, depth - 1);
    }
 done1:
    return next_token(s);
}